

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_uastc_enc.cpp
# Opt level: O1

bool basisu::uastc_rdo_blocks
               (uint32_t first_index,uint32_t last_index,uastc_block *pBlocks,
               color_rgba *pBlock_pixels,uastc_rdo_params *params,uint32_t flags,
               uint32_t *total_skipped,uint32_t *total_refined,uint32_t *total_modified,
               uint32_t *total_smooth)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t i;
  uint uVar4;
  long lVar5;
  long lVar6;
  iterator iVar7;
  ulong uVar8;
  sbyte sVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint32_t num_pixels;
  anon_union_16_2_e7f8845d_for_uastc_block_0 *paVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int *piVar21;
  unpacked_uastc_block *puVar22;
  astc_block_desc *paVar23;
  byte bVar24;
  uint32_t mul_search_rad;
  ulong uVar25;
  anon_union_4_3_898e29d3_for_color32_0 *paVar26;
  uint32_t table_mask;
  ulong uVar27;
  uint64_t bits_1;
  long lVar28;
  uint32_t uVar29;
  long lVar30;
  uastc_block *blk;
  long lVar31;
  uint uVar32;
  long lVar33;
  byte bVar34;
  float fVar35;
  undefined1 extraout_var [12];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar38 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar39 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 auVar40 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 auVar41 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  anon_union_16_2_e7f8845d_for_uastc_block_0 in_XMM1;
  float fVar45;
  pair<std::__detail::_Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false>,_bool>
  pVar46;
  bc7_block trial_b7_block;
  uastc_block best_block;
  unpacked_uastc_block unpacked_prev_blk;
  color_rgba decoded_trial_b7_blk [4] [4];
  color_rgba decoded_trial_uastc_block [4] [4];
  unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
  selector_history;
  bc7_optimization_results trial_b7_results;
  bc7_block b7_block;
  unpacked_uastc_block unpacked_trial_blk;
  color_rgba decoded_b7_blk [4] [4];
  color_rgba decoded_uastc_block [4] [4];
  unpacked_uastc_block unpacked_blk;
  bc7_optimization_results b7_results;
  bool local_53e;
  bool local_53d;
  float local_53c;
  ulong local_538;
  float local_52c;
  anon_union_16_2_e7f8845d_for_uastc_block_0 local_528;
  uastc_rdo_params *local_510;
  float local_508;
  float local_504;
  color_rgba *local_500;
  uint local_4f4;
  ulong local_4f0;
  color_rgba *local_4e8;
  anon_union_16_2_e7f8845d_for_uastc_block_0 *local_4e0;
  color_rgba *local_4d8;
  ulong local_4d0;
  float local_4c4;
  float local_4c0;
  uint local_4bc;
  uint32_t local_4b8;
  uint32_t local_4b4;
  uint local_4b0;
  int local_4ac;
  eac_a8_block local_4a8 [2];
  anon_union_16_2_e7f8845d_for_uastc_block_0 local_498;
  ulong local_480;
  ulong local_478;
  uastc_block *local_470;
  undefined1 local_468 [16];
  ulong local_458;
  ulong local_450;
  ulong local_448;
  uint8_t *local_440;
  ulong local_438;
  unpacked_uastc_block local_430;
  anon_union_8_2_04352b30_for_etc_block_0 local_398;
  undefined8 uStack_390;
  undefined1 local_388 [12];
  undefined4 uStack_37c;
  anon_union_4_3_898e29d3_for_color32_0 local_358 [18];
  _Hashtable<basisu::selector_bitsequence,_std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<basisu::selector_bitsequence>,_basisu::selector_bitsequence_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_310;
  uastc_encode_results local_2d8;
  undefined1 local_250 [8];
  uint8_t auStack_248 [8];
  unpacked_uastc_block local_240;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_1a8 [16];
  anon_union_4_3_898e29d3_for_color32_0 local_168 [16];
  unpacked_uastc_block local_128;
  bc7_optimization_results local_90;
  
  bVar34 = 0;
  uVar19 = (ulong)first_index;
  local_470 = pBlocks;
  debug_printf("uastc_rdo_blocks: Processing blocks %u to %u\n",uVar19,(ulong)last_index);
  uVar4 = params->m_lz_dict_size >> 4;
  local_4ac = uVar4 + (uVar4 == 0);
  local_310._M_buckets = &local_310._M_single_bucket;
  local_310._M_bucket_count = 1;
  local_310._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_310._M_element_count = 0;
  local_310._M_rehash_policy._M_max_load_factor = 1.0;
  local_310._M_rehash_policy._M_next_resize = 0;
  local_310._M_single_bucket = (__node_base_ptr)0x0;
  bVar2 = true;
  local_510 = params;
  if (first_index < last_index) {
    local_4f4 = flags & 0xf;
    local_440 = (pBlock_pixels->field_0).m_comps + 3;
    local_478 = uVar19 << 4;
    local_4e8 = pBlock_pixels;
    local_4b8 = flags;
    local_4b4 = first_index;
    local_438 = (ulong)last_index;
    do {
      paVar15 = &local_470[uVar19].field_0;
      bVar2 = basist::unpack_uastc((uastc_block *)paVar15,&local_128,false,true);
      auVar36._4_12_ = in_XMM1._4_12_;
      uVar4 = 1;
      if (!bVar2) goto LAB_00260a6f;
      uVar8 = (ulong)local_128.m_mode;
      uVar4 = 4;
      if (uVar8 == 8) goto LAB_00260a6f;
      uVar25 = local_478 >> 4 & 0xfffffff;
      local_500 = pBlock_pixels + uVar25 * 0x10;
      local_4d8 = pBlock_pixels + (uint)((int)uVar19 << 4);
      lVar6 = 0;
      lVar14 = 0;
      lVar5 = 0;
      lVar16 = 0;
      lVar33 = 0;
      lVar18 = 0;
      lVar30 = 0;
      lVar28 = 0;
      lVar31 = 0;
      do {
        bVar24 = local_440[lVar6 * 4 + uVar25 * 0x40 + -3];
        lVar14 = lVar14 + (ulong)bVar24;
        lVar5 = lVar5 + (ulong)((uint)bVar24 * (uint)bVar24);
        bVar24 = local_440[lVar6 * 4 + uVar25 * 0x40 + -2];
        lVar16 = lVar16 + (ulong)bVar24;
        lVar33 = lVar33 + (ulong)((uint)bVar24 * (uint)bVar24);
        bVar24 = local_440[lVar6 * 4 + uVar25 * 0x40 + -1];
        bVar1 = local_440[lVar6 * 4 + uVar25 * 0x40];
        lVar6 = lVar6 + 1;
        lVar18 = lVar18 + (ulong)bVar24;
        lVar30 = lVar30 + (ulong)((uint)bVar24 * (uint)bVar24);
        lVar28 = lVar28 + (ulong)bVar1;
        lVar31 = lVar31 + (ulong)((uint)bVar1 * (uint)bVar1);
      } while (lVar6 != 0x10);
      fVar43 = (float)(ulong)(lVar5 * 0x10 - lVar14 * lVar14);
      local_538 = uVar19;
      local_4e0 = paVar15;
      local_4d0 = uVar8;
      if (fVar43 < 0.0) {
        fVar43 = sqrtf(fVar43);
        auVar36._4_4_ = extraout_var._0_4_;
        auVar36._0_4_ = fVar43;
        auVar36._8_4_ = extraout_var._4_4_;
        auVar36._12_4_ = extraout_var._8_4_;
      }
      else {
        auVar36._0_4_ = SQRT(fVar43);
      }
      local_468._4_12_ = auVar36._4_12_;
      local_468._0_4_ = auVar36._0_4_ * 0.0625;
      fVar43 = (float)(ulong)(lVar33 * 0x10 - lVar16 * lVar16);
      if (fVar43 < 0.0) {
        fVar43 = sqrtf(fVar43);
      }
      else {
        fVar43 = SQRT(fVar43);
      }
      pBlock_pixels = local_4e8;
      uVar19 = local_538;
      local_53c = fVar43 * 0.0625;
      fVar43 = (float)(ulong)(lVar30 * 0x10 - lVar18 * lVar18);
      if (fVar43 < 0.0) {
        fVar43 = sqrtf(fVar43);
      }
      else {
        fVar43 = SQRT(fVar43);
      }
      paVar15 = local_4e0;
      local_52c = fVar43 * 0.0625;
      fVar43 = (float)(ulong)(lVar31 * 0x10 - lVar28 * lVar28);
      if (fVar43 < 0.0) {
        fVar43 = sqrtf(fVar43);
      }
      else {
        fVar43 = SQRT(fVar43);
      }
      fVar45 = (float)local_468._0_4_;
      if ((float)local_468._0_4_ <= local_53c) {
        fVar45 = local_53c;
      }
      if (fVar45 <= local_52c) {
        fVar45 = local_52c;
      }
      if (fVar45 <= fVar43 * 0.0625) {
        fVar45 = fVar43 * 0.0625;
      }
      fVar45 = fVar45 / local_510->m_max_smooth_block_std_dev;
      in_XMM1._0_12_ = ZEXT812(0x3f800000);
      in_XMM1.m_dwords[3] = 0;
      fVar43 = 1.0;
      if (fVar45 <= 1.0) {
        fVar43 = fVar45;
      }
      fVar43 = (float)(~-(uint)(fVar45 < 0.0) & (uint)fVar43);
      local_52c = (1.0 - local_510->m_smooth_block_max_error_scale) * fVar43 * fVar43 +
                  local_510->m_smooth_block_max_error_scale;
      if (1.0 < local_52c) {
        *total_smooth = *total_smooth + 1;
      }
      bVar2 = basist::unpack_uastc(&local_128,(color32 *)&local_168[0].field_0,false);
      uVar4 = 1;
      if (!bVar2) goto LAB_00260a6f;
      lVar6 = 0;
      lVar5 = 0;
      auVar36 = extraout_XMM0;
      do {
        auVar36 = pmovzxbd(auVar36,local_500[lVar6].field_0);
        in_XMM1.m_bytes = (uint8_t  [16])pmovzxbd(in_XMM1.m_bytes,local_168[lVar6].m);
        auVar37._0_4_ = auVar36._0_4_ - in_XMM1.m_dwords[0];
        auVar37._4_4_ = auVar36._4_4_ - in_XMM1.m_dwords[1];
        auVar37._8_4_ = auVar36._8_4_ - in_XMM1.m_dwords[2];
        auVar37._12_4_ = auVar36._12_4_ - in_XMM1.m_dwords[3];
        auVar36 = pmulld(auVar37,auVar37);
        auVar36 = phaddd(auVar36,auVar36);
        auVar36 = phaddd(auVar36,auVar36);
        lVar5 = lVar5 + (ulong)auVar36._0_4_;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      bVar2 = basist::transcode_uastc_to_bc7(&local_128,&local_90);
      uVar4 = 1;
      if (!bVar2) goto LAB_00260a6f;
      basist::encode_bc7_block(local_250,&local_90);
      unpack_block(cBC7,local_250,(color_rgba *)&local_1a8[0].field_1);
      lVar14 = 0;
      lVar6 = 0;
      auVar36 = extraout_XMM0_00;
      do {
        auVar36 = pmovzxbd(auVar36,local_500[lVar14].field_0);
        in_XMM1.m_bytes = (uint8_t  [16])pmovzxbd(in_XMM1.m_bytes,local_1a8[lVar14]);
        auVar38._0_4_ = auVar36._0_4_ - in_XMM1.m_dwords[0];
        auVar38._4_4_ = auVar36._4_4_ - in_XMM1.m_dwords[1];
        auVar38._8_4_ = auVar36._8_4_ - in_XMM1.m_dwords[2];
        auVar38._12_4_ = auVar36._12_4_ - in_XMM1.m_dwords[3];
        auVar36 = pmulld(auVar38,auVar38);
        auVar36 = phaddd(auVar36,auVar36);
        auVar36 = phaddd(auVar36,auVar36);
        lVar6 = lVar6 + (ulong)auVar36._0_4_;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x10);
      local_53c = (float)((ulong)(lVar6 + lVar5) >> 1) * 0.015625;
      if (local_53c < 0.0) {
        fVar43 = sqrtf(local_53c);
      }
      else {
        fVar43 = SQRT(local_53c);
      }
      uVar19 = local_538;
      bVar24 = g_uastc_mode_selector_bits[local_4d0 * 2];
      uVar8 = (ulong)bVar24;
      bVar1 = g_uastc_mode_selector_bits[local_4d0 * 2 + 1];
      if (0x80 < (uint)bVar1 + (uint)bVar24) {
        __assert_fail("first_sel_bit + total_sel_bits <= 128",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                      ,0xf53,
                      "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                     );
      }
      if (bVar1 == 0) {
        __assert_fail("total_sel_bits > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                      ,0xf54,
                      "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                     );
      }
      uVar17 = 0x40;
      if (bVar1 < 0x40) {
        uVar17 = (uint)bVar1;
      }
      local_430.m_astc._0_8_ = 0;
      uVar4 = 0;
      local_430.m_astc.m_partition_seed = (int)bVar24;
      do {
        uVar10 = (uint)uVar8 & 7;
        iVar13 = 8 - uVar10;
        if ((int)(uVar17 - uVar4) < iVar13) {
          iVar13 = uVar17 - uVar4;
        }
        uVar10 = (uint)(paVar15->m_bytes[uVar8 >> 3] >> (sbyte)uVar10);
        uVar25 = (ulong)uVar10;
        uVar27 = (ulong)(~(-1 << ((byte)iVar13 & 0x1f)) & uVar10) << ((byte)uVar4 & 0x3f);
        local_430.m_astc._0_8_ = local_430.m_astc._0_8_ | uVar27;
        uVar4 = uVar4 + iVar13;
        uVar8 = (ulong)((uint)uVar8 + iVar13);
      } while (uVar4 < uVar17);
      local_4f0 = (ulong)bVar1;
      if (local_510->m_skip_block_rms_thresh <= fVar43) {
        iVar13 = (int)local_538;
        local_430.m_astc.m_ccs = iVar13;
        pVar46 = std::
                 _Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 ::_M_emplace<std::pair<basisu::selector_bitsequence,unsigned_int>>
                           ((_Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                             *)&local_310,&local_430);
        if (((undefined1  [16])pVar46 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          *(int *)((long)pVar46.first.
                         super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                         ._M_cur.
                         super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                  + 0x18) = iVar13;
        }
        *total_skipped = *total_skipped + 1;
        uVar4 = 4;
        pBlock_pixels = local_4e8;
        goto LAB_00260a6f;
      }
      uVar10 = (uint)bVar24;
      local_4c0 = fVar43;
      local_430.m_astc.m_partition_seed = uVar10;
      iVar7 = std::
              _Hashtable<basisu::selector_bitsequence,_std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<basisu::selector_bitsequence>,_basisu::selector_bitsequence_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&local_310,(key_type *)&local_430);
      table_mask = (uint32_t)uVar27;
      mul_search_rad = (uint32_t)uVar25;
      fVar43 = (float)local_538;
      if (iVar7.
          super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
          ._M_cur == (__node_type *)0x0) {
        uVar4 = (local_510->m_lz_literal_cost * (int)local_4f0) / 100;
      }
      else {
        uVar4 = ((int)fVar43 -
                *(int *)((long)iVar7.
                               super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                               ._M_cur + 0x18)) * 0x10;
        if (uVar4 < 0x200) {
          iVar13 = (byte)g_tdefl_small_dist_extra[uVar4] + 5;
        }
        else {
          uVar32 = 0x7fff;
          if (uVar4 < 0x7fff) {
            uVar32 = uVar4;
          }
          iVar13 = (byte)g_tdefl_large_dist_extra[uVar32 >> 8] + 5;
          if (0x7fff < uVar4) {
            do {
              iVar13 = iVar13 + 1;
              bVar2 = 0xffff < uVar4;
              uVar4 = uVar4 >> 1;
            } while (bVar2);
          }
        }
        uVar4 = iVar13 + 7;
      }
      uVar29 = (int)fVar43 - local_4ac;
      if ((int)fVar43 - local_4ac < (int)local_4b4) {
        uVar29 = local_4b4;
      }
      local_498 = *paVar15;
      fVar45 = (float)((int)fVar43 - 1);
      local_468._0_4_ = uVar29;
      uVar32 = (uint)bVar24;
      if ((int)fVar45 < (int)uVar29) {
        uVar4 = 0xe;
      }
      else {
        in_XMM1 = (anon_union_16_2_e7f8845d_for_uastc_block_0)ZEXT416((uint)(local_53c * local_52c))
        ;
        local_504 = (float)(int)uVar4 * local_510->m_lambda + local_53c * local_52c;
        local_448 = 1L << ((byte)uVar17 & 0x3f);
        local_480 = local_448 - 1;
        if (0x3f < (byte)local_4f0) {
          local_480 = 0xffffffffffffffff;
        }
        local_4b0 = (int)local_4f0 - 0x40;
        local_4bc = uVar17 + bVar24;
        local_458 = 1L << ((byte)local_4f0 & 0x3f);
        local_450 = local_458 - 1;
        local_508 = fVar43;
        if (local_4b0 == 0x40) {
          local_450 = 0xffffffffffffffff;
        }
        do {
          blk = local_470 + (int)fVar45;
          uVar19 = 0;
          uVar4 = 0;
          uVar8 = (ulong)uVar10;
          do {
            uVar11 = (uint)uVar8 & 7;
            iVar13 = 8 - uVar11;
            if ((int)(uVar17 - uVar4) < iVar13) {
              iVar13 = uVar17 - uVar4;
            }
            uVar19 = uVar19 | (ulong)(~(-1 << ((byte)iVar13 & 0x1f)) &
                                     (uint)((blk->field_0).m_bytes[uVar8 >> 3] >> (sbyte)uVar11)) <<
                              ((byte)uVar4 & 0x3f);
            uVar4 = uVar4 + iVar13;
            uVar8 = (ulong)(iVar13 + (uint)uVar8);
          } while (uVar4 < uVar17);
          local_430.m_astc._0_8_ = uVar19;
          local_430.m_astc.m_partition_seed = uVar10;
          iVar7 = std::
                  _Hashtable<basisu::selector_bitsequence,_std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<basisu::selector_bitsequence>,_basisu::selector_bitsequence_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&local_310,(key_type *)&local_430);
          local_53c = fVar45;
          if (iVar7.
              super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
              ._M_cur != (__node_type *)0x0) {
            local_53c = *(float *)((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                                         ._M_cur + 0x18);
          }
          uVar4 = 0x10;
          if ((int)local_53c <= (int)fVar45) {
            bVar2 = basist::unpack_uastc(blk,&local_430,false,true);
            uVar4 = 1;
            if (bVar2) {
              local_528.m_dwords[0] = (uint32_t)*(undefined8 *)local_4e0;
              local_528.m_dwords[1] = (uint32_t)((ulong)*(undefined8 *)local_4e0 >> 0x20);
              local_528.m_dwords[2] = (uint32_t)*(undefined8 *)(local_4e0->m_bytes + 8);
              local_528.m_dwords[3] =
                   (uint32_t)((ulong)*(undefined8 *)(local_4e0->m_bytes + 8) >> 0x20);
              uVar27 = local_480;
              uVar4 = uVar17;
              if ((byte)local_4f0 < 0x40) {
                uVar20 = (ulong)uVar32;
                if (local_448 <= uVar19) goto LAB_00260abb;
              }
              else {
                uVar20 = (ulong)uVar10;
              }
              do {
                uVar12 = (uint)uVar20 & 7;
                uVar11 = 8 - uVar12;
                if (uVar4 <= uVar11) {
                  uVar11 = uVar4;
                }
                sVar9 = (sbyte)uVar12;
                lVar6 = uVar27 << sVar9;
                bVar24 = ~(byte)lVar6 & local_528.m_bytes[uVar20 >> 3];
                uVar25 = CONCAT71((int7)((ulong)lVar6 >> 8),bVar24);
                lVar6 = uVar19 << sVar9;
                uVar19 = uVar19 >> ((byte)uVar11 & 0x3f);
                local_528.m_bytes[uVar20 >> 3] = (byte)lVar6 | bVar24;
                uVar20 = (ulong)((uint)uVar20 + uVar11);
                uVar4 = uVar4 - uVar11;
                uVar27 = uVar27 >> ((byte)uVar11 & 0x3f);
              } while (uVar4 != 0);
              uVar27 = (ulong)local_4b0;
              if (0x40 < (byte)local_4f0) {
                if (0x40 < local_4b0) {
                  __assert_fail("codesize <= 64",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                                ,0x5a,
                                "uint64_t basisu::read_bits(const uint8_t *, uint32_t &, uint32_t)")
                  ;
                }
                uVar19 = 0;
                if (local_4b0 != 0) {
                  uVar4 = 0;
                  do {
                    uVar11 = (uint)uVar8 & 7;
                    iVar13 = 8 - uVar11;
                    if ((int)(local_4b0 - uVar4) < iVar13) {
                      iVar13 = local_4b0 - uVar4;
                    }
                    uVar25 = (ulong)(~(-1 << ((byte)iVar13 & 0x1f)) &
                                    (uint)((blk->field_0).m_bytes[uVar8 >> 3] >> (sbyte)uVar11)) <<
                             ((byte)uVar4 & 0x3f);
                    uVar19 = uVar19 | uVar25;
                    uVar4 = uVar4 + iVar13;
                    uVar8 = (ulong)((uint)uVar8 + iVar13);
                  } while (uVar4 < local_4b0);
                }
                if ((local_4b0 != 0x40) && (local_458 <= uVar19)) {
LAB_00260abb:
                  __assert_fail("(num_bits == 64) || (val < (1ULL << num_bits))",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                                ,0xea0,
                                "uint32_t basisu::set_block_bits(uint8_t *, uint64_t, uint32_t, uint32_t)"
                               );
                }
                if (local_4b0 != 0) {
                  uVar25 = (ulong)local_4b0;
                  uVar8 = local_450;
                  uVar4 = local_4bc;
                  do {
                    uVar11 = 8 - (uVar4 & 7);
                    uVar12 = (uint)uVar25;
                    if (uVar12 <= uVar11) {
                      uVar11 = uVar12;
                    }
                    sVar9 = (sbyte)(uVar4 & 7);
                    lVar6 = uVar8 << sVar9;
                    bVar24 = ~(byte)lVar6 & local_528.m_bytes[uVar4 >> 3];
                    uVar27 = CONCAT71((int7)((ulong)lVar6 >> 8),bVar24);
                    lVar6 = uVar19 << sVar9;
                    uVar19 = uVar19 >> ((byte)uVar11 & 0x3f);
                    uVar8 = uVar8 >> ((byte)uVar11 & 0x3f);
                    local_528.m_bytes[uVar4 >> 3] = (byte)lVar6 | bVar24;
                    uVar4 = uVar4 + uVar11;
                    uVar25 = (ulong)(uVar12 - uVar11);
                  } while (uVar12 - uVar11 != 0);
                }
              }
              bVar2 = basist::unpack_uastc((uastc_block *)&local_528,&local_240,false,true);
              uVar4 = 0x10;
              if (bVar2) {
                bVar2 = basist::unpack_uastc(&local_240,(color32 *)&local_358[0].field_0,false);
                uVar4 = 0x10;
                if (bVar2) {
                  lVar6 = 0;
                  lVar5 = 0;
                  auVar36 = extraout_XMM0_01;
                  do {
                    auVar36 = pmovzxbd(auVar36,local_500[lVar6].field_0);
                    in_XMM1.m_bytes = (uint8_t  [16])pmovzxbd(in_XMM1.m_bytes,local_358[lVar6].m);
                    auVar39._0_4_ = auVar36._0_4_ - in_XMM1.m_dwords[0];
                    auVar39._4_4_ = auVar36._4_4_ - in_XMM1.m_dwords[1];
                    auVar39._8_4_ = auVar36._8_4_ - in_XMM1.m_dwords[2];
                    auVar39._12_4_ = auVar36._12_4_ - in_XMM1.m_dwords[3];
                    auVar36 = pmulld(auVar39,auVar39);
                    auVar36 = phaddd(auVar36,auVar36);
                    auVar36 = phaddd(auVar36,auVar36);
                    lVar5 = lVar5 + (ulong)auVar36._0_4_;
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 0x10);
                  bVar2 = basist::transcode_uastc_to_bc7
                                    (&local_240,(bc7_optimization_results *)&local_2d8);
                  uVar4 = 1;
                  if (bVar2) {
                    basist::encode_bc7_block(local_4a8,(bc7_optimization_results *)&local_2d8);
                    unpack_block(cBC7,local_4a8,(color_rgba *)&local_398);
                    lVar14 = 0;
                    lVar6 = 0;
                    auVar36 = extraout_XMM0_02;
                    do {
                      auVar36 = pmovzxbd(auVar36,local_500[lVar14].field_0);
                      in_XMM1.m_bytes =
                           (uint8_t  [16])
                           pmovzxbd(in_XMM1.m_bytes,*(undefined4 *)((long)&local_398 + lVar14 * 4));
                      auVar40._0_4_ = auVar36._0_4_ - in_XMM1.m_dwords[0];
                      auVar40._4_4_ = auVar36._4_4_ - in_XMM1.m_dwords[1];
                      auVar40._8_4_ = auVar36._8_4_ - in_XMM1.m_dwords[2];
                      auVar40._12_4_ = auVar36._12_4_ - in_XMM1.m_dwords[3];
                      auVar36 = pmulld(auVar40,auVar40);
                      auVar36 = phaddd(auVar36,auVar36);
                      auVar36 = phaddd(auVar36,auVar36);
                      lVar6 = lVar6 + (ulong)auVar36._0_4_;
                      lVar14 = lVar14 + 1;
                    } while (lVar14 != 0x10);
                    fVar43 = (float)((ulong)(lVar6 + lVar5) >> 1) * 0.015625;
                    if (fVar43 < 0.0) {
                      local_4c4 = fVar43;
                      fVar35 = sqrtf(fVar43);
                      fVar43 = local_4c4;
                    }
                    else {
                      fVar35 = SQRT(fVar43);
                    }
                    fVar44 = local_510->m_max_allowed_rms_increase_ratio * local_4c0;
                    in_XMM1 = (anon_union_16_2_e7f8845d_for_uastc_block_0)ZEXT416((uint)fVar44);
                    uVar4 = 0x10;
                    if (fVar35 <= fVar44) {
                      uVar4 = ((int)local_538 - (int)local_53c) * 0x10;
                      if (uVar4 < 0x200) {
                        iVar13 = (byte)g_tdefl_small_dist_extra[uVar4] + 5;
                      }
                      else {
                        uVar11 = 0x7fff;
                        if (uVar4 < 0x7fff) {
                          uVar11 = uVar4;
                        }
                        iVar13 = (byte)g_tdefl_large_dist_extra[uVar11 >> 8] + 5;
                        if (0x7fff < uVar4) {
                          uVar19 = (ulong)uVar4;
                          do {
                            iVar13 = iVar13 + 1;
                            uVar4 = (uint)uVar19;
                            uVar19 = uVar19 >> 1;
                          } while (0xffff < uVar4);
                        }
                      }
                      fVar43 = (float)(iVar13 + 7) * local_510->m_lambda + fVar43 * local_52c;
                      uVar4 = 0;
                      in_XMM1 = (anon_union_16_2_e7f8845d_for_uastc_block_0)ZEXT416((uint)local_504)
                      ;
                      if (fVar43 < local_504) {
                        in_XMM1.m_dwords[1] = local_528.m_dwords[1];
                        in_XMM1.m_dwords[0] = local_528.m_dwords[0];
                        in_XMM1.m_dwords[2] = local_528.m_dwords[2];
                        in_XMM1.m_dwords[3] = local_528.m_dwords[3];
                        local_498 = in_XMM1;
                        local_508 = fVar45;
                        local_504 = fVar43;
                      }
                    }
                  }
                }
              }
            }
          }
          table_mask = (uint32_t)uVar27;
          mul_search_rad = (uint32_t)uVar25;
          fVar43 = local_508;
          if ((uVar4 & 0xf) != 0) goto LAB_00260589;
          fVar45 = (float)((int)fVar45 - 1);
        } while ((int)local_468._0_4_ <= (int)fVar45);
        uVar4 = 0xe;
      }
LAB_00260589:
      uVar19 = local_538;
      pBlock_pixels = local_4e8;
      if (uVar4 != 0xe) goto LAB_00260a6f;
      if (local_538 == (uint)fVar43) goto LAB_0026059f;
      *total_modified = *total_modified + 1;
      bVar2 = basist::unpack_uastc((uastc_block *)&local_498,&local_240,false,false);
      if (!bVar2) goto LAB_00260a60;
      if ((local_4d0 == 0) && (local_510->m_endpoint_refinement != false)) {
        bVar2 = basist::unpack_uastc(&local_240,(color32 *)&local_2d8,false);
        if (bVar2) {
          lVar6 = 0;
          uVar19 = 0;
          auVar36 = extraout_XMM0_03;
          do {
            auVar36 = pmovzxbd(auVar36,local_500[lVar6].field_0);
            in_XMM1.m_bytes =
                 (uint8_t  [16])
                 pmovzxbd(in_XMM1.m_bytes,
                          *(undefined4 *)(local_2d8.m_astc.m_endpoints + lVar6 * 4 + -0x1d));
            auVar41._0_4_ = auVar36._0_4_ - in_XMM1.m_dwords[0];
            auVar41._4_4_ = auVar36._4_4_ - in_XMM1.m_dwords[1];
            auVar41._8_4_ = auVar36._8_4_ - in_XMM1.m_dwords[2];
            auVar41._12_4_ = auVar36._12_4_ - in_XMM1.m_dwords[3];
            auVar36 = pmulld(auVar41,auVar41);
            auVar36 = phaddd(auVar36,auVar36);
            auVar36 = phaddd(auVar36,auVar36);
            uVar19 = uVar19 + auVar36._0_4_;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x10);
          local_388 = SUB1612((undefined1  [16])0x0,0);
          uStack_37c = 1;
          local_398.m_uint64 = 0x100000040;
          uStack_390 = 0x100000001;
          local_388._0_8_ = 1;
          local_528.m_dwords[0] = 0;
          astc_mode0_or_18(0,(color_rgba (*) [4])local_4d8,(uastc_encode_results *)&local_430,
                           (uint32_t *)local_528.m_bytes,(bc7enc_compress_block_params *)&local_398,
                           local_240.m_astc.m_weights);
          if (local_528.m_dwords[0] != 1) {
            __assert_fail("total_results == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                          ,0xff0,
                          "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                         );
          }
          local_4a8[0]._0_4_ = local_430.m_solid_color.field_0;
          paVar26 = local_358;
          table_mask = 0;
          bVar3 = basist::unpack_uastc
                            (local_430.m_astc.m_weight_range,local_430.m_astc.m_subsets,
                             (color32 *)local_4a8,
                             (astc_block_desc *)&local_430.m_astc.m_partition_seed,
                             (color32 *)&paVar26->field_0,false);
          mul_search_rad = (uint32_t)paVar26;
          if (!bVar3) {
            __assert_fail("success",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                          ,0xff6,
                          "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                         );
          }
          lVar6 = 0;
          uVar8 = 0;
          auVar36 = extraout_XMM0_04;
          do {
            auVar36 = pmovzxbd(auVar36,local_500[lVar6].field_0);
            in_XMM1.m_bytes = (uint8_t  [16])pmovzxbd(in_XMM1.m_bytes,local_358[lVar6].m);
            auVar42._0_4_ = auVar36._0_4_ - in_XMM1.m_dwords[0];
            auVar42._4_4_ = auVar36._4_4_ - in_XMM1.m_dwords[1];
            auVar42._8_4_ = auVar36._8_4_ - in_XMM1.m_dwords[2];
            auVar42._12_4_ = auVar36._12_4_ - in_XMM1.m_dwords[3];
            auVar36 = pmulld(auVar42,auVar42);
            auVar36 = phaddd(auVar36,auVar36);
            auVar36 = phaddd(auVar36,auVar36);
            uVar8 = uVar8 + auVar36._0_4_;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x10);
          if (uVar8 < uVar19) {
            lVar6 = 0x2f;
            do {
              if (auStack_248[lVar6] != local_430.m_astc.m_endpoints[lVar6 + -0x15]) {
                __assert_fail("unpacked_best_blk.m_astc.m_weights[i] == results.m_astc.m_weights[i]"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                              ,0x1004,
                              "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                             );
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0x3f);
            piVar21 = &local_430.m_astc.m_partition_seed;
            puVar22 = &local_240;
            for (lVar6 = 0x1a; lVar6 != 0; lVar6 = lVar6 + -1) {
              (puVar22->m_astc).m_weight_range = *piVar21;
              piVar21 = piVar21 + (ulong)bVar34 * -2 + 1;
              puVar22 = (unpacked_uastc_block *)((long)puVar22 + ((ulong)bVar34 * -2 + 1) * 4);
            }
            *total_refined = *total_refined + 1;
          }
          if (bVar2) goto LAB_0026081d;
        }
        goto LAB_00260a60;
      }
LAB_0026081d:
      memcpy(&local_430,&local_240,0x98);
      bVar2 = basist::unpack_uastc(&local_430,(color32 *)&local_358[0].field_0,false);
      if (!bVar2) goto LAB_00260a60;
      puVar22 = &local_430;
      paVar23 = &local_2d8.m_astc;
      for (lVar6 = 0x1a; lVar6 != 0; lVar6 = lVar6 + -1) {
        paVar23->m_weight_range = (puVar22->m_astc).m_weight_range;
        puVar22 = (unpacked_uastc_block *)((long)puVar22 + (ulong)bVar34 * -8 + 4);
        paVar23 = (astc_block_desc *)((long)paVar23 + ((ulong)bVar34 * -2 + 1) * 4);
      }
      local_2d8.m_solid_color.field_0 =
           (anon_union_4_2_6eba8969_for_color_rgba_0)local_430.m_solid_color.field_0;
      local_2d8.m_astc_err = 0;
      uVar29 = 0xffffffff;
      bVar3 = true;
      switch(local_4f4) {
      case 0:
        bVar3 = false;
        goto LAB_002608df;
      case 1:
LAB_002608df:
        uVar29 = 0x2904;
        num_pixels = 0;
        break;
      case 2:
        uVar29 = 0x2dc5;
        num_pixels = 1;
        break;
      case 3:
        num_pixels = 2;
        break;
      default:
        num_pixels = 3;
      }
      local_53d = false;
      local_53e = false;
      if (bVar3) {
        paVar26 = local_358;
        compute_bc1_hints(&local_53d,&local_53e,&local_2d8,(color_rgba (*) [4])local_4d8,
                          (color_rgba (*) [4])paVar26);
        mul_search_rad = (uint32_t)paVar26;
      }
      if (((ulong)local_430.m_mode == 8) ||
         (basist::g_uastc_mode_has_alpha[local_430.m_mode] == '\0')) {
        local_4a8[0] = (eac_a8_block)0x0;
      }
      else {
        uVar19 = 0;
        do {
          local_398.m_bytes[uVar19] =
               local_358[(uVar19 >> 2 & 0x3fffffff) * 4 + (ulong)((uint)uVar19 & 3)].field_0.a;
          uVar19 = uVar19 + 1;
        } while (uVar19 != 0x10);
        local_528.m_dwords[2] = 0;
        local_528.m_dwords[0] = 0;
        local_528.m_dwords[1] = 0;
        uastc_pack_eac_a8((uastc_pack_eac_a8_results *)&local_528,local_398.m_bytes,num_pixels,
                          uVar29,mul_search_rad,table_mask);
        local_4a8[0]._0_2_ =
             (ushort)(local_528.m_dwords[2] << 0xc) |
             (ushort)((local_528.m_dwords[1] & 0xf) << 8) | (ushort)(byte)local_4a8[0]._0_1_;
      }
      local_528.m_dwords[0] = 0;
      compute_etc1_hints((etc_block *)&local_398,(uint32_t *)local_528.m_bytes,&local_2d8,
                         (color_rgba (*) [4])local_4d8,(color_rgba (*) [4])local_358,local_4f4,
                         local_4b8);
      paVar15 = local_4e0;
      pack_uastc((uastc_block *)&local_498,&local_2d8,(etc_block *)&local_398,local_528.m_dwords[0],
                 local_4a8,local_53d,local_53e);
      if (bVar2) {
        *(undefined8 *)paVar15 = local_498._0_8_;
        *(undefined8 *)(paVar15->m_bytes + 8) = local_498._8_8_;
LAB_0026059f:
        local_430.m_astc._0_8_ = 0;
        uVar10 = 0;
        uVar4 = uVar32;
        do {
          iVar13 = 8 - (uVar4 & 7);
          if ((int)(uVar17 - uVar10) < iVar13) {
            iVar13 = uVar17 - uVar10;
          }
          local_430.m_astc._0_8_ =
               local_430.m_astc._0_8_ |
               (ulong)(~(-1 << ((byte)iVar13 & 0x1f)) &
                      (uint)(local_498.m_bytes[uVar4 >> 3] >> (sbyte)(uVar4 & 7))) <<
               ((byte)uVar10 & 0x3f);
          uVar10 = uVar10 + iVar13;
          uVar4 = uVar4 + iVar13;
        } while (uVar10 < uVar17);
        iVar13 = (int)local_538;
        local_430.m_astc.m_partition_seed = uVar32;
        local_430.m_astc.m_ccs = iVar13;
        pVar46 = std::
                 _Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 ::_M_emplace<std::pair<basisu::selector_bitsequence,unsigned_int>>
                           ((_Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                             *)&local_310,&local_430);
        uVar4 = 0;
        uVar19 = local_538;
        pBlock_pixels = local_4e8;
        if (((undefined1  [16])pVar46 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          *(int *)((long)pVar46.first.
                         super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                         ._M_cur.
                         super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                  + 0x18) = iVar13;
        }
      }
      else {
LAB_00260a60:
        uVar4 = 1;
        uVar19 = local_538;
        pBlock_pixels = local_4e8;
      }
LAB_00260a6f:
      if ((uVar4 & 0x1b) != 0) goto LAB_00260a93;
      uVar19 = uVar19 + 1;
      local_478 = local_478 + 0x10;
    } while (uVar19 != local_438);
    uVar4 = 2;
LAB_00260a93:
    bVar2 = uVar4 == 2;
  }
  std::
  _Hashtable<basisu::selector_bitsequence,_std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<basisu::selector_bitsequence>,_basisu::selector_bitsequence_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_310);
  return bVar2;
}

Assistant:

static bool uastc_rdo_blocks(uint32_t first_index, uint32_t last_index, basist::uastc_block* pBlocks, const color_rgba* pBlock_pixels, const uastc_rdo_params& params, uint32_t flags, 
		uint32_t &total_skipped, uint32_t &total_refined, uint32_t &total_modified, uint32_t &total_smooth)
	{
		debug_printf("uastc_rdo_blocks: Processing blocks %u to %u\n", first_index, last_index);

		const int total_blocks_to_check = basisu::maximum<uint32_t>(1U, params.m_lz_dict_size / sizeof(basist::uastc_block));
		const bool perceptual = false;

		std::unordered_map<selector_bitsequence, uint32_t, selector_bitsequence_hash> selector_history;
						
		for (uint32_t block_index = first_index; block_index < last_index; block_index++)
		{
			const basist::uastc_block& blk = pBlocks[block_index];
			const color_rgba* pPixels = &pBlock_pixels[16 * block_index];

			unpacked_uastc_block unpacked_blk;
			if (!unpack_uastc(blk, unpacked_blk, false, true))
				return false;

			const uint32_t block_mode = unpacked_blk.m_mode;
			if (block_mode == UASTC_MODE_INDEX_SOLID_COLOR)
				continue;

			tracked_stat r_stats, g_stats, b_stats, a_stats;

			for (uint32_t i = 0; i < 16; i++)
			{
				r_stats.update(pPixels[i].r);
				g_stats.update(pPixels[i].g);
				b_stats.update(pPixels[i].b);
				a_stats.update(pPixels[i].a);
			}

			const float max_std_dev = basisu::maximum<float>(basisu::maximum<float>(basisu::maximum(r_stats.get_std_dev(), g_stats.get_std_dev()), b_stats.get_std_dev()), a_stats.get_std_dev());

			float yl = clamp<float>(max_std_dev / params.m_max_smooth_block_std_dev, 0.0f, 1.0f);
			yl = yl * yl;
			const float smooth_block_error_scale = lerp<float>(params.m_smooth_block_max_error_scale, 1.0f, yl);
			if (smooth_block_error_scale > 1.0f)
				total_smooth++;

			color_rgba decoded_uastc_block[4][4];
			if (!unpack_uastc(unpacked_blk, (basist::color32*)decoded_uastc_block, false))
				return false;

			uint64_t uastc_err = 0;
			for (uint32_t i = 0; i < 16; i++)
				uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_uastc_block)[i], true);

			// Transcode to BC7
			bc7_optimization_results b7_results;
			if (!transcode_uastc_to_bc7(unpacked_blk, b7_results))
				return false;

			basist::bc7_block b7_block;
			basist::encode_bc7_block(&b7_block, &b7_results);

			color_rgba decoded_b7_blk[4][4];
			unpack_block(texture_format::cBC7, &b7_block, &decoded_b7_blk[0][0]);
						
			uint64_t bc7_err = 0;
			for (uint32_t i = 0; i < 16; i++)
				bc7_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_b7_blk)[i], true);

			uint64_t cur_err = (uastc_err + bc7_err) / 2;

			// Divide by 16*4 to compute RMS error
			const float cur_ms_err = (float)cur_err * (1.0f / 64.0f);
			const float cur_rms_err = sqrt(cur_ms_err);

			const uint32_t first_sel_bit = g_uastc_mode_selector_bits[block_mode][0];
			const uint32_t total_sel_bits = g_uastc_mode_selector_bits[block_mode][1];
			assert(first_sel_bit + total_sel_bits <= 128);
			assert(total_sel_bits > 0);

			uint32_t cur_bit_offset = first_sel_bit;
			uint64_t cur_sel_bits = read_bits((const uint8_t*)&blk, cur_bit_offset, basisu::minimum(64U, total_sel_bits));

			if (cur_rms_err >= params.m_skip_block_rms_thresh)
			{
				auto cur_search_res = selector_history.insert(std::make_pair(selector_bitsequence(first_sel_bit, cur_sel_bits), block_index));

				// Block already has too much error, so don't mess with it.
				if (!cur_search_res.second)
					(*cur_search_res.first).second = block_index;

				total_skipped++;
				continue;
			}

			int cur_bits;
			auto cur_find_res = selector_history.find(selector_bitsequence(first_sel_bit, cur_sel_bits));
			if (cur_find_res == selector_history.end())
			{
				// Wasn't found - wildly estimate literal cost
				//cur_bits = (total_sel_bits * 5) / 4;
				cur_bits = (total_sel_bits * params.m_lz_literal_cost) / 100;
			}
			else
			{
				// Was found - wildly estimate match cost
				uint32_t match_block_index = cur_find_res->second;
				const int block_dist_in_bytes = (block_index - match_block_index) * 16;
				cur_bits = compute_match_cost_estimate(block_dist_in_bytes);
			}

			int first_block_to_check = basisu::maximum<int>(first_index, block_index - total_blocks_to_check);
			int last_block_to_check = block_index - 1;

			basist::uastc_block best_block(blk);
			uint32_t best_block_index = block_index;

			float best_t = cur_ms_err * smooth_block_error_scale + cur_bits * params.m_lambda;

			// Now scan through previous blocks, insert their selector bit patterns into the current block, and find 
			// selector bit patterns which don't increase the overall block error too much.
			for (int prev_block_index = last_block_to_check; prev_block_index >= first_block_to_check; --prev_block_index)
			{
				const basist::uastc_block& prev_blk = pBlocks[prev_block_index];

				uint32_t bit_offset = first_sel_bit;
				uint64_t sel_bits = read_bits((const uint8_t*)&prev_blk, bit_offset, basisu::minimum(64U, total_sel_bits));

				int match_block_index = prev_block_index;
				auto res = selector_history.find(selector_bitsequence(first_sel_bit, sel_bits));
				if (res != selector_history.end())
					match_block_index = res->second;
				// Have we already checked this bit pattern? If so then skip this block.
				if (match_block_index > prev_block_index)
					continue;

				unpacked_uastc_block unpacked_prev_blk;
				if (!unpack_uastc(prev_blk, unpacked_prev_blk, false, true))
					return false;

				basist::uastc_block trial_blk(blk);

				set_block_bits((uint8_t*)&trial_blk, sel_bits, basisu::minimum(64U, total_sel_bits), first_sel_bit);

				if (total_sel_bits > 64)
				{
					sel_bits = read_bits((const uint8_t*)&prev_blk, bit_offset, total_sel_bits - 64U);

					set_block_bits((uint8_t*)&trial_blk, sel_bits, total_sel_bits - 64U, first_sel_bit + basisu::minimum(64U, total_sel_bits));
				}

				unpacked_uastc_block unpacked_trial_blk;
				if (!unpack_uastc(trial_blk, unpacked_trial_blk, false, true))
					continue;

				color_rgba decoded_trial_uastc_block[4][4];
				if (!unpack_uastc(unpacked_trial_blk, (basist::color32*)decoded_trial_uastc_block, false))
					continue;

				uint64_t trial_uastc_err = 0;
				for (uint32_t i = 0; i < 16; i++)
					trial_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_uastc_block)[i], true);

				// Transcode trial to BC7, compute error
				bc7_optimization_results trial_b7_results;
				if (!transcode_uastc_to_bc7(unpacked_trial_blk, trial_b7_results))
					return false;

				basist::bc7_block trial_b7_block;
				basist::encode_bc7_block(&trial_b7_block, &trial_b7_results);

				color_rgba decoded_trial_b7_blk[4][4];
				unpack_block(texture_format::cBC7, &trial_b7_block, &decoded_trial_b7_blk[0][0]);

				uint64_t trial_bc7_err = 0;
				for (uint32_t i = 0; i < 16; i++)
					trial_bc7_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_b7_blk)[i], true);

				uint64_t trial_err = (trial_uastc_err + trial_bc7_err) / 2;

				const float trial_ms_err = (float)trial_err * (1.0f / 64.0f);
				const float trial_rms_err = sqrtf(trial_ms_err);

				if (trial_rms_err > cur_rms_err * params.m_max_allowed_rms_increase_ratio)
					continue;

				const int block_dist_in_bytes = (block_index - match_block_index) * 16;
				const int match_bits = compute_match_cost_estimate(block_dist_in_bytes);

				float t = trial_ms_err * smooth_block_error_scale + match_bits * params.m_lambda;
				if (t < best_t)
				{
					best_t = t;
					best_block_index = prev_block_index;

					best_block = trial_blk;
				}

			} // prev_block_index

			if (best_block_index != block_index)
			{
				total_modified++;

				unpacked_uastc_block unpacked_best_blk;
				if (!unpack_uastc(best_block, unpacked_best_blk, false, false))
					return false;

				if ((params.m_endpoint_refinement) && (block_mode == 0))
				{
					// Attempt to refine mode 0 block's endpoints, using the new selectors. This doesn't help much, but it does help.
					// TODO: We could do this with the other modes too.
					color_rgba decoded_best_uastc_block[4][4];
					if (!unpack_uastc(unpacked_best_blk, (basist::color32*)decoded_best_uastc_block, false))
						return false;

					// Compute the block's current error (with the modified selectors).
					uint64_t best_uastc_err = 0;
					for (uint32_t i = 0; i < 16; i++)
						best_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_best_uastc_block)[i], true);

					bc7enc_compress_block_params comp_params;
					memset(&comp_params, 0, sizeof(comp_params));
					comp_params.m_max_partitions_mode1 = 64;
					comp_params.m_least_squares_passes = 1;
					comp_params.m_weights[0] = 1;
					comp_params.m_weights[1] = 1;
					comp_params.m_weights[2] = 1;
					comp_params.m_weights[3] = 1;
					comp_params.m_uber_level = 0;

					uastc_encode_results results;
					uint32_t total_results = 0;
					astc_mode0_or_18(0, (color_rgba(*)[4])pPixels, &results, total_results, comp_params, unpacked_best_blk.m_astc.m_weights);
					assert(total_results == 1);

					// See if the overall error has actually gone done.

					color_rgba decoded_trial_uastc_block[4][4];
					bool success = unpack_uastc(results.m_uastc_mode, results.m_common_pattern, results.m_solid_color.get_color32(), results.m_astc, (basist::color32*) & decoded_trial_uastc_block[0][0], false);
					assert(success);
					
					BASISU_NOTE_UNUSED(success);

					uint64_t trial_uastc_err = 0;
					for (uint32_t i = 0; i < 16; i++)
						trial_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_uastc_block)[i], true);

					if (trial_uastc_err < best_uastc_err)
					{
						// The error went down, so accept the new endpoints.

						// Ensure the selectors haven't changed, otherwise we'll invalidate the LZ matches.
						for (uint32_t i = 0; i < 16; i++)
							assert(unpacked_best_blk.m_astc.m_weights[i] == results.m_astc.m_weights[i]);

						unpacked_best_blk.m_astc = results.m_astc;

						total_refined++;
					}
				} // if ((params.m_endpoint_refinement) && (block_mode == 0))

				// The selectors have changed, so go recompute the block hints.
				if (!uastc_recompute_hints(&best_block, pPixels, flags, &unpacked_best_blk))
					return false;

				// Write the modified block
				pBlocks[block_index] = best_block;
			
			} // if (best_block_index != block_index)

			{
				uint32_t bit_offset = first_sel_bit;
				uint64_t sel_bits = read_bits((const uint8_t*)&best_block, bit_offset, basisu::minimum(64U, total_sel_bits));

				auto res = selector_history.insert(std::make_pair(selector_bitsequence(first_sel_bit, sel_bits), block_index));
				if (!res.second)
					(*res.first).second = block_index;
			}

		} // block_index

		return true;
	}